

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

double relive::LogManager::log(double __x)

{
  bool bVar1;
  code cVar2;
  int iVar3;
  __pid_t _Var4;
  ostream *poVar5;
  long lVar6;
  tm *ptVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  ostream *poVar9;
  int in_ECX;
  undefined8 *in_RDX;
  int iVar10;
  _func_int *p_Var11;
  string *in_RSI;
  char *pcVar12;
  uint in_EDI;
  undefined8 *in_R8;
  int in_R9D;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  _Put_time<char> __f;
  undefined8 *in_stack_00000008;
  time_t time;
  stringstream ss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_1b8._8_8_ = 0;
  local_1b8[0x10] = '\0';
  local_1b8._0_8_ = local_1b8 + 0x10;
  instance((string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  }
  bVar1 = isActive(&instance::logManager,in_RSI,in_R9D);
  if (!bVar1) {
    return extraout_XMM0_Qa;
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&instance::logManager);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar9 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[",1);
  if ((instance::logManager._logStyle & 1U) != 0) {
    _Var4 = getpid();
    poVar5 = (ostream *)std::ostream::operator<<(poVar9,_Var4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  }
  if ((instance::logManager._logStyle & 2U) != 0) {
    symbolicThreadId(&instance::logManager);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  }
  if (in_EDI < 4 && (instance::logManager._logStyle & 4U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,&DAT_001d2734 + *(int *)(&DAT_001d2734 + (ulong)in_EDI * 4),
               *(long *)(&DAT_001d2748 + (ulong)in_EDI * 8));
  }
  iVar3 = instance::logManager._logStyle;
  iVar10 = 0;
  if ((instance::logManager._logStyle & 8U) != 0) {
    lVar6 = std::chrono::_V2::system_clock::now();
    local_1d8 = (long *)(lVar6 / 1000000000);
    ptVar7 = localtime((time_t *)&local_1d8);
    __f._M_fmt = "%FT%T.";
    __f._M_tmb = (tm *)ptVar7;
    pbVar8 = std::operator<<(poVar9,__f);
    p_Var11 = (_func_int *)
              ((long)&pbVar8->_vptr_basic_ostream + (long)pbVar8->_vptr_basic_ostream[-3]);
    if ((&pbVar8->field_0xe1)[(long)pbVar8->_vptr_basic_ostream[-3]] == '\0') {
      cVar2 = (code)std::ios::widen((char)p_Var11);
      p_Var11[0xe0] = cVar2;
      p_Var11[0xe1] = (code)0x1;
    }
    p_Var11[0xe0] = (code)0x30;
    *(undefined8 *)(&pbVar8->field_0x10 + (long)pbVar8->_vptr_basic_ostream[-3]) = 3;
    std::ostream::_M_insert<long>((long)pbVar8);
    iVar10 = 1;
  }
  if ((instance::logManager._logStyle & 0x20U) != 0) {
    if ((iVar3 & 8U) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)*in_RDX,in_RDX[1]);
    iVar10 = iVar10 + 1;
  }
  if ((instance::logManager._logStyle & 0x40U) == 0) goto LAB_00133f3f;
  if ((instance::logManager._logStyle & 0x20U) == 0) {
    if (iVar10 != 0) {
      lVar6 = 7;
      pcVar12 = ", line ";
      goto LAB_00133f26;
    }
  }
  else {
    lVar6 = 1;
    pcVar12 = ":";
LAB_00133f26:
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,lVar6);
  }
  iVar10 = 1;
  std::ostream::operator<<(poVar9,in_ECX);
LAB_00133f3f:
  if ((instance::logManager._logStyle & 0x10U) != 0) {
    if (iVar10 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)*in_R8,in_R8[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
  poVar9 = instance::logManager._os;
  std::__cxx11::stringbuf::str();
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_1d8,local_1d0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)*in_stack_00000008,in_stack_00000008[1]);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  pthread_mutex_unlock((pthread_mutex_t *)&instance::logManager);
  return extraout_XMM0_Qa_00;
}

Assistant:

void LogManager::log(LogType type, const std::string& className, const std::string& file, int line, const std::string& function, int level, const std::string& message)
{
    LogManager* logManager = instance();
    if(logManager->isActive(className, level))
    {
        std::lock_guard<std::mutex> lock(logManager->_mutex);
        std::stringstream ss;
        int fields = 0;
        ss << "[";
#ifndef _WIN32
        if (logManager->_logStyle & eShowPID) {
            ss << getpid() << ":";
        }
        if (logManager->_logStyle & eShowTID) {
            ss << logManager->symbolicThreadId() << ":";
        }
#if 0
#if defined(__APPLE__) && defined(__MACH__)
        if (logManager->_logStyle & eShowTID) {
            //ss << pthread_mach_thread_np(pthread_self()) << ":";
            ss << std::this_thread::get_id() << ":";
        }
#else
        if (logManager->_logStyle & eShowTID) {
            ss << pthread_self() << ":";
        }
#endif
#endif
#endif
        if (logManager->_logStyle & eShowType) {
            switch (type) {
                case LogType::eError:
                    ss << "ERROR: ";
                    break;
                case LogType::eWarning:
                    ss << "WARNING: ";
                    break;
                case LogType::eInfo:
                    ss << "INFO: ";
                    break;
                case LogType::eDebug:
                    ss << "DEBUG: ";
                    break;
            }
        }
        if (logManager->_logStyle & eShowTimestamp) {
            auto now = std::chrono::system_clock::now();
            auto duration = now.time_since_epoch();
            auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(duration).count() % 1000;
            const time_t time = std::chrono::system_clock::to_time_t(now);
            ss << std::put_time(std::localtime(&time), "%FT%T.") << std::setfill('0') << std::setw(3) << millis;
            ++fields;
        }
        if (logManager->_logStyle & eShowFile) {
            if (fields++) {
                ss << ", ";
            }
            ss << file;
        }
        if (logManager->_logStyle & eShowLine) {
            if (logManager->_logStyle & eShowFile) {
                ss << ":";
            } else if (fields) {
                ss << ", line ";
            }
            ss << line;
            ++fields;
        }
        if (logManager->_logStyle & eShowFunction) {
            if (fields++) {
                ss << ", ";
            }
            ss << "[" << function << "]";
        }
        ss << "] ";
        *logManager->_os << ss.str() << message << std::endl;
    }
}